

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O0

bool __thiscall
nanoflann::KNNResultSet<double,_unsigned_long,_unsigned_long>::addPoint
          (KNNResultSet<double,_unsigned_long,_unsigned_long> *this,DistanceType_conflict dist,
          IndexType index)

{
  ulong local_28;
  CountType i;
  IndexType index_local;
  DistanceType_conflict dist_local;
  KNNResultSet<double,_unsigned_long,_unsigned_long> *this_local;
  
  for (local_28 = this->count; (local_28 != 0 && (dist < this->dists[local_28 - 1]));
      local_28 = local_28 - 1) {
    if (local_28 < this->capacity) {
      this->dists[local_28] = this->dists[local_28 - 1];
      this->indices[local_28] = this->indices[local_28 - 1];
    }
  }
  if (local_28 < this->capacity) {
    this->dists[local_28] = dist;
    this->indices[local_28] = index;
  }
  if (this->count < this->capacity) {
    this->count = this->count + 1;
  }
  return true;
}

Assistant:

inline bool addPoint(DistanceType dist, IndexType index)
    {
        CountType i;
        for (i = count; i > 0; --i)
        {
#ifdef NANOFLANN_FIRST_MATCH  // If defined and two points have the same
                              // distance, the one with the lowest-index will be
                              // returned first.
            if ((dists[i - 1] > dist) ||
                ((dist == dists[i - 1]) && (indices[i - 1] > index)))
            {
#else
            if (dists[i - 1] > dist)
            {
#endif
                if (i < capacity)
                {
                    dists[i]   = dists[i - 1];
                    indices[i] = indices[i - 1];
                }
            }
            else
                break;
        }
        if (i < capacity)
        {
            dists[i]   = dist;
            indices[i] = index;
        }
        if (count < capacity) count++;

        // tell caller that the search shall continue
        return true;
    }

    inline DistanceType worstDist() const { return dists[capacity - 1]; }
}